

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio_impl.cpp
# Opt level: O3

void __thiscall ui::Gpio::Fetch(Gpio *this)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_240 [2];
  long local_230 [2];
  istream local_220 [520];
  
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar1,pcVar1 + (this->path_)._M_string_length);
  std::__cxx11::string::append((char *)local_240);
  std::ifstream::ifstream(local_220,(string *)local_240,_S_in);
  std::operator>>(local_220,(string *)&this->label_);
  std::ifstream::~ifstream(local_220);
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar1,pcVar1 + (this->path_)._M_string_length);
  std::__cxx11::string::append((char *)local_240);
  std::ifstream::ifstream(local_220,(string *)local_240,_S_in);
  std::operator>>(local_220,(string *)&this->edge_);
  std::ifstream::~ifstream(local_220);
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar1,pcVar1 + (this->path_)._M_string_length);
  std::__cxx11::string::append((char *)local_240);
  std::ifstream::ifstream(local_220,(string *)local_240,_S_in);
  std::operator>>(local_220,(string *)&this->direction_);
  std::ifstream::~ifstream(local_220);
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar1,pcVar1 + (this->path_)._M_string_length);
  std::__cxx11::string::append((char *)local_240);
  std::ifstream::ifstream(local_220,(string *)local_240,_S_in);
  std::operator>>(local_220,(string *)&this->value_);
  std::ifstream::~ifstream(local_220);
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  pcVar1 = (this->path_)._M_dataplus._M_p;
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_240,pcVar1,pcVar1 + (this->path_)._M_string_length);
  std::__cxx11::string::append((char *)local_240);
  std::ifstream::ifstream(local_220,(string *)local_240,_S_in);
  std::operator>>(local_220,(string *)&this->active_low_);
  std::ifstream::~ifstream(local_220);
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  return;
}

Assistant:

void Fetch() {
    std::ifstream(path_ + "/label") >> label_;
    std::ifstream(path_ + "/edge") >> edge_;
    std::ifstream(path_ + "/direction") >> direction_;
    std::ifstream(path_ + "/value") >> value_;
    std::ifstream(path_ + "/active_low") >> active_low_;
  }